

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-x509.c
# Opt level: O2

void lws_x509_destroy(lws_x509_cert **x509)

{
  lws_x509_cert *ptr;
  
  ptr = *x509;
  if (ptr != (lws_x509_cert *)0x0) {
    if ((X509 *)ptr->cert != (X509 *)0x0) {
      X509_free((X509 *)ptr->cert);
      (*x509)->cert = (X509 *)0x0;
      ptr = *x509;
    }
    lws_realloc(ptr,0,"free");
    *x509 = (lws_x509_cert *)0x0;
  }
  return;
}

Assistant:

void
lws_x509_destroy(struct lws_x509_cert **x509)
{
	if (!*x509)
		return;

	if ((*x509)->cert) {
		X509_free((*x509)->cert);
		(*x509)->cert = NULL;
	}

	lws_free_set_NULL(*x509);
}